

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::AddAndOwn
          (SimpleDescriptorDatabase *this,FileDescriptorProto *file)

{
  pointer *pppFVar1;
  iterator __position;
  bool bVar2;
  FileDescriptorProto *local_10;
  
  __position._M_current =
       (this->files_to_delete_).
       super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_10 = file;
  if (__position._M_current ==
      (this->files_to_delete_).
      super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::FileDescriptorProto_const*,std::allocator<google::protobuf::FileDescriptorProto_const*>>
    ::_M_realloc_insert<google::protobuf::FileDescriptorProto_const*const&>
              ((vector<google::protobuf::FileDescriptorProto_const*,std::allocator<google::protobuf::FileDescriptorProto_const*>>
                *)&this->files_to_delete_,__position,&local_10);
  }
  else {
    *__position._M_current = file;
    pppFVar1 = &(this->files_to_delete_).
                super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  bVar2 = DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
                    (&this->index_,local_10,local_10);
  return bVar2;
}

Assistant:

bool SimpleDescriptorDatabase::AddAndOwn(const FileDescriptorProto* file) {
  files_to_delete_.push_back(file);
  return index_.AddFile(*file, file);
}